

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

V1LayerParameter_LayerType caffe::UpgradeV0LayerType(string *type)

{
  int iVar1;
  V1LayerParameter_LayerType VVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  if (iVar1 == 0) {
    VVar2 = V1LayerParameter_LayerType_ACCURACY;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)type);
    if (iVar1 == 0) {
      VVar2 = V1LayerParameter_LayerType_BNLL;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)type);
      if (iVar1 == 0) {
        VVar2 = V1LayerParameter_LayerType_CONCAT;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)type);
        if (iVar1 == 0) {
          VVar2 = V1LayerParameter_LayerType_CONVOLUTION;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)type);
          if (iVar1 == 0) {
            VVar2 = V1LayerParameter_LayerType_DATA;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)type);
            if (iVar1 == 0) {
              VVar2 = V1LayerParameter_LayerType_DROPOUT;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)type);
              if (iVar1 == 0) {
                VVar2 = V1LayerParameter_LayerType_EUCLIDEAN_LOSS;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)type);
                if (iVar1 == 0) {
                  VVar2 = V1LayerParameter_LayerType_FLATTEN;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)type);
                  if (iVar1 == 0) {
                    VVar2 = V1LayerParameter_LayerType_HDF5_DATA;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)type);
                    if (iVar1 == 0) {
                      VVar2 = V1LayerParameter_LayerType_HDF5_OUTPUT;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)type);
                      if (iVar1 == 0) {
                        VVar2 = V1LayerParameter_LayerType_IM2COL;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)type);
                        if (iVar1 == 0) {
                          VVar2 = V1LayerParameter_LayerType_IMAGE_DATA;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)type);
                          if (iVar1 == 0) {
                            VVar2 = V1LayerParameter_LayerType_INFOGAIN_LOSS;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)type);
                            if (iVar1 == 0) {
                              VVar2 = V1LayerParameter_LayerType_INNER_PRODUCT;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)type);
                              if (iVar1 == 0) {
                                VVar2 = V1LayerParameter_LayerType_LRN;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)type);
                                if (iVar1 == 0) {
                                  VVar2 = V1LayerParameter_LayerType_MULTINOMIAL_LOGISTIC_LOSS;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)type);
                                  if (iVar1 == 0) {
                                    VVar2 = V1LayerParameter_LayerType_POOLING;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)type);
                                    if (iVar1 == 0) {
                                      VVar2 = V1LayerParameter_LayerType_RELU;
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)type);
                                      if (iVar1 == 0) {
                                        VVar2 = V1LayerParameter_LayerType_SIGMOID;
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)type);
                                        if (iVar1 == 0) {
                                          VVar2 = V1LayerParameter_LayerType_SOFTMAX;
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare((char *)type);
                                          if (iVar1 == 0) {
                                            VVar2 = V1LayerParameter_LayerType_SOFTMAX_LOSS;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare((char *)type);
                                            if (iVar1 == 0) {
                                              VVar2 = V1LayerParameter_LayerType_SPLIT;
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare((char *)type);
                                              if (iVar1 == 0) {
                                                VVar2 = V1LayerParameter_LayerType_TANH;
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare((char *)type);
                                                if (iVar1 == 0) {
                                                  VVar2 = V1LayerParameter_LayerType_WINDOW_DATA;
                                                }
                                                else {
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cerr,
                                                             "Unknown layer name: ",0x14);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cerr,
                                                             (type->_M_dataplus)._M_p,
                                                             type->_M_string_length);
                                                  VVar2 = V1LayerParameter_LayerType_NONE;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return VVar2;
}

Assistant:

V1LayerParameter_LayerType UpgradeV0LayerType(const string& type) {
  if (type == "accuracy") {
    return V1LayerParameter_LayerType_ACCURACY;
  } else if (type == "bnll") {
    return V1LayerParameter_LayerType_BNLL;
  } else if (type == "concat") {
    return V1LayerParameter_LayerType_CONCAT;
  } else if (type == "conv") {
    return V1LayerParameter_LayerType_CONVOLUTION;
  } else if (type == "data") {
    return V1LayerParameter_LayerType_DATA;
  } else if (type == "dropout") {
    return V1LayerParameter_LayerType_DROPOUT;
  } else if (type == "euclidean_loss") {
    return V1LayerParameter_LayerType_EUCLIDEAN_LOSS;
  } else if (type == "flatten") {
    return V1LayerParameter_LayerType_FLATTEN;
  } else if (type == "hdf5_data") {
    return V1LayerParameter_LayerType_HDF5_DATA;
  } else if (type == "hdf5_output") {
    return V1LayerParameter_LayerType_HDF5_OUTPUT;
  } else if (type == "im2col") {
    return V1LayerParameter_LayerType_IM2COL;
  } else if (type == "images") {
    return V1LayerParameter_LayerType_IMAGE_DATA;
  } else if (type == "infogain_loss") {
    return V1LayerParameter_LayerType_INFOGAIN_LOSS;
  } else if (type == "innerproduct") {
    return V1LayerParameter_LayerType_INNER_PRODUCT;
  } else if (type == "lrn") {
    return V1LayerParameter_LayerType_LRN;
  } else if (type == "multinomial_logistic_loss") {
    return V1LayerParameter_LayerType_MULTINOMIAL_LOGISTIC_LOSS;
  } else if (type == "pool") {
    return V1LayerParameter_LayerType_POOLING;
  } else if (type == "relu") {
    return V1LayerParameter_LayerType_RELU;
  } else if (type == "sigmoid") {
    return V1LayerParameter_LayerType_SIGMOID;
  } else if (type == "softmax") {
    return V1LayerParameter_LayerType_SOFTMAX;
  } else if (type == "softmax_loss") {
    return V1LayerParameter_LayerType_SOFTMAX_LOSS;
  } else if (type == "split") {
    return V1LayerParameter_LayerType_SPLIT;
  } else if (type == "tanh") {
    return V1LayerParameter_LayerType_TANH;
  } else if (type == "window_data") {
    return V1LayerParameter_LayerType_WINDOW_DATA;
  } else {
    LOG(FATAL) << "Unknown layer name: " << type;
    return V1LayerParameter_LayerType_NONE;
  }
}